

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r1mpyq.c
# Opt level: O1

void r1mpyq(int m,int n,double *a,int lda,double *v,double *w)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  int a_dim1;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  if (1 < n) {
    lVar5 = (long)~lda;
    lVar7 = (long)lda;
    lVar4 = (long)(lda * n);
    uVar6 = (ulong)(uint)n;
    pdVar8 = a + (uVar6 - 1) * lVar7 + lVar5;
    uVar9 = 1;
    do {
      dVar10 = v[(uVar6 - uVar9) + -1];
      if (ABS(dVar10) <= 1.0) {
        dVar11 = 1.0 - dVar10 * dVar10;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
      }
      else {
        dVar11 = 1.0 / dVar10;
        dVar10 = 1.0 - dVar11 * dVar11;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
      }
      if (0 < m) {
        uVar3 = 1;
        do {
          dVar1 = pdVar8[uVar3];
          dVar2 = a[lVar5 + lVar4 + uVar3];
          a[lVar5 + lVar4 + uVar3] = dVar1 * dVar10 + dVar2 * dVar11;
          pdVar8[uVar3] = dVar11 * dVar1 + dVar2 * -dVar10;
          uVar3 = uVar3 + 1;
        } while (m + 1 != uVar3);
      }
      uVar9 = uVar9 + 1;
      pdVar8 = pdVar8 + -lVar7;
    } while (uVar9 != uVar6);
    pdVar8 = a + lVar7 + lVar5;
    uVar9 = 1;
    do {
      dVar10 = w[uVar9 - 1];
      if (ABS(dVar10) <= 1.0) {
        dVar11 = 1.0 - dVar10 * dVar10;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
      }
      else {
        dVar11 = 1.0 / dVar10;
        dVar10 = 1.0 - dVar11 * dVar11;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
      }
      if (0 < m) {
        uVar3 = 1;
        do {
          dVar1 = pdVar8[uVar3];
          dVar2 = a[lVar5 + lVar4 + uVar3];
          a[lVar5 + lVar4 + uVar3] = dVar1 * -dVar10 + dVar2 * dVar11;
          pdVar8[uVar3] = dVar11 * dVar1 + dVar10 * dVar2;
          uVar3 = uVar3 + 1;
        } while (m + 1 != uVar3);
      }
      uVar9 = uVar9 + 1;
      pdVar8 = pdVar8 + lVar7;
    } while (uVar9 != uVar6);
  }
  return;
}

Assistant:

__cminpack_attr__
void __cminpack_func__(r1mpyq)(int m, int n, real *a, int
	lda, const real *v, const real *w)
{
    /* System generated locals */
    int a_dim1, a_offset;

    /* Local variables */
    int i, j, nm1, nmj;
    real cos, sin, temp;

/*     ********** */

/*     subroutine r1mpyq */

/*     given an m by n matrix a, this subroutine computes a*q where */
/*     q is the product of 2*(n - 1) transformations */

/*           gv(n-1)*...*gv(1)*gw(1)*...*gw(n-1) */

/*     and gv(i), gw(i) are givens rotations in the (i,n) plane which */
/*     eliminate elements in the i-th and n-th planes, respectively. */
/*     q itself is not given, rather the information to recover the */
/*     gv, gw rotations is supplied. */

/*     the subroutine statement is */

/*       subroutine r1mpyq(m,n,a,lda,v,w) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a must contain the matrix */
/*         to be postmultiplied by the orthogonal matrix q */
/*         described above. on output a*q has replaced a. */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       v is an input array of length n. v(i) must contain the */
/*         information necessary to recover the givens rotation gv(i) */
/*         described above. */

/*       w is an input array of length n. w(i) must contain the */
/*         information necessary to recover the givens rotation gw(i) */
/*         described above. */

/*     subroutines called */

/*       fortran-supplied ... dabs,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --w;
    --v;
    a_dim1 = lda;
    a_offset = 1 + a_dim1 * 1;
    a -= a_offset;

    /* Function Body */

/*     apply the first set of givens rotations to a. */

    nm1 = n - 1;
    if (nm1 < 1) {
        return;
    }
    for (nmj = 1; nmj <= nm1; ++nmj) {
	j = n - nmj;
	if (fabs(v[j]) > 1.) {
	    cos = 1 / v[j];
	    sin = sqrt(1 - cos * cos);
	} else {
	    sin = v[j];
	    cos = sqrt(1 - sin * sin);
	}
	for (i = 1; i <= m; ++i) {
	    temp = cos * a[i + j * a_dim1] - sin * a[i + n * a_dim1];
	    a[i + n * a_dim1] = sin * a[i + j * a_dim1] + cos * a[
		    i + n * a_dim1];
	    a[i + j * a_dim1] = temp;
	}
    }

/*     apply the second set of givens rotations to a. */

    for (j = 1; j <= nm1; ++j) {
	if (fabs(w[j]) > 1.) {
	    cos = 1 / w[j];
	    sin = sqrt(1 - cos * cos);
	} else {
	    sin = w[j];
	    cos = sqrt(1 - sin * sin);
	}
	for (i = 1; i <= m; ++i) {
	    temp = cos * a[i + j * a_dim1] + sin * a[i + n * a_dim1];
	    a[i + n * a_dim1] = -sin * a[i + j * a_dim1] + cos * a[i + n * a_dim1];
	    a[i + j * a_dim1] = temp;
	}
    }

/*     last card of subroutine r1mpyq. */

}